

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  uint uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 (*pauVar48) [16];
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  undefined1 (*pauVar55) [16];
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar64 [32];
  undefined1 auVar63 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar78;
  float fVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar80;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar92;
  undefined1 auVar87 [32];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  __m128 a;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar146;
  undefined1 auVar137 [32];
  float fVar145;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar147;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [64];
  undefined1 auVar157 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a49;
  ulong local_2a48;
  uint local_2a40;
  uint local_2a3c;
  ulong local_2a38;
  undefined1 local_2a30 [16];
  undefined1 local_2a20 [16];
  undefined1 (*local_2a08) [16];
  ulong local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  long local_29d0;
  long local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  ulong local_29a0;
  undefined1 (*local_2998) [16];
  long local_2990;
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined8 local_2940;
  undefined8 uStack_2938;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined1 local_2920 [16];
  undefined1 auStack_2910 [16];
  undefined1 local_2900 [16];
  undefined1 auStack_28f0 [16];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 *local_27e0;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  float local_2740 [4];
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  undefined4 uStack_2724;
  float local_2720 [4];
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700 [4];
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 local_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined1 local_2670 [16];
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [8];
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined1 local_2580 [32];
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar55 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_25c0._4_4_ = uVar1;
  local_25c0._0_4_ = uVar1;
  local_25c0._8_4_ = uVar1;
  local_25c0._12_4_ = uVar1;
  local_25c0._16_4_ = uVar1;
  local_25c0._20_4_ = uVar1;
  local_25c0._24_4_ = uVar1;
  local_25c0._28_4_ = uVar1;
  auVar128 = ZEXT3264(local_25c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_25e0._4_4_ = uVar1;
  local_25e0._0_4_ = uVar1;
  local_25e0._8_4_ = uVar1;
  local_25e0._12_4_ = uVar1;
  local_25e0._16_4_ = uVar1;
  local_25e0._20_4_ = uVar1;
  local_25e0._24_4_ = uVar1;
  local_25e0._28_4_ = uVar1;
  auVar122 = ZEXT3264(local_25e0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2520._4_4_ = uVar1;
  local_2520._0_4_ = uVar1;
  local_2520._8_4_ = uVar1;
  local_2520._12_4_ = uVar1;
  local_2520._16_4_ = uVar1;
  local_2520._20_4_ = uVar1;
  local_2520._24_4_ = uVar1;
  local_2520._28_4_ = uVar1;
  auVar150 = ZEXT3264(local_2520);
  fVar99 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar91 = fVar99 * 0.99999964;
  fVar93 = fVar82 * 0.99999964;
  fVar95 = fVar89 * 0.99999964;
  fVar99 = fVar99 * 1.0000004;
  local_2640._4_4_ = fVar99;
  local_2640._0_4_ = fVar99;
  local_2640._8_4_ = fVar99;
  local_2640._12_4_ = fVar99;
  local_2640._16_4_ = fVar99;
  local_2640._20_4_ = fVar99;
  local_2640._24_4_ = fVar99;
  local_2640._28_4_ = fVar99;
  auVar112 = ZEXT3264(local_2640);
  fVar82 = fVar82 * 1.0000004;
  fVar89 = fVar89 * 1.0000004;
  local_29a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_29a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_29b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29b8 = local_29a0 ^ 0x20;
  local_29c0 = local_29a8 ^ 0x20;
  uVar54 = local_29b0 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_28a0._4_4_ = iVar2;
  local_28a0._0_4_ = iVar2;
  local_28a0._8_4_ = iVar2;
  local_28a0._12_4_ = iVar2;
  local_28a0._16_4_ = iVar2;
  local_28a0._20_4_ = iVar2;
  local_28a0._24_4_ = iVar2;
  local_28a0._28_4_ = iVar2;
  auVar167 = ZEXT3264(local_28a0);
  iVar2 = (tray->tfar).field_0.i[k];
  local_28c0._4_4_ = iVar2;
  local_28c0._0_4_ = iVar2;
  local_28c0._8_4_ = iVar2;
  local_28c0._12_4_ = iVar2;
  local_28c0._16_4_ = iVar2;
  local_28c0._20_4_ = iVar2;
  local_28c0._24_4_ = iVar2;
  local_28c0._28_4_ = iVar2;
  local_29d8 = local_29a0 >> 2;
  local_29e0 = local_29b8 >> 2;
  local_2580._16_16_ = mm_lookupmask_ps._240_16_;
  local_2580._0_16_ = mm_lookupmask_ps._0_16_;
  local_2a08 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_29e8 = local_29a8 >> 2;
  local_29f0 = local_29c0 >> 2;
  local_29f8 = local_29b0 >> 2;
  local_2a00 = uVar54 >> 2;
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar64._8_4_ = 0xbf800000;
  auVar64._0_8_ = 0xbf800000bf800000;
  auVar64._12_4_ = 0xbf800000;
  auVar64._16_4_ = 0xbf800000;
  auVar64._20_4_ = 0xbf800000;
  auVar64._24_4_ = 0xbf800000;
  auVar64._28_4_ = 0xbf800000;
  _local_25a0 = vblendvps_avx(auVar84,auVar64,local_2580);
  local_2600 = fVar91;
  fStack_25fc = fVar91;
  fStack_25f8 = fVar91;
  fStack_25f4 = fVar91;
  fStack_25f0 = fVar91;
  fStack_25ec = fVar91;
  fStack_25e8 = fVar91;
  fStack_25e4 = fVar91;
  local_2620 = fVar93;
  fStack_261c = fVar93;
  fStack_2618 = fVar93;
  fStack_2614 = fVar93;
  fStack_2610 = fVar93;
  fStack_260c = fVar93;
  fStack_2608 = fVar93;
  fStack_2604 = fVar93;
  local_2540 = fVar95;
  fStack_253c = fVar95;
  fStack_2538 = fVar95;
  fStack_2534 = fVar95;
  fStack_2530 = fVar95;
  fStack_252c = fVar95;
  fStack_2528 = fVar95;
  fStack_2524 = fVar95;
  local_2560 = fVar82;
  fStack_255c = fVar82;
  fStack_2558 = fVar82;
  fStack_2554 = fVar82;
  fStack_2550 = fVar82;
  fStack_254c = fVar82;
  fStack_2548 = fVar82;
  fStack_2544 = fVar82;
  fVar160 = fVar89;
  fVar161 = fVar89;
  fVar162 = fVar89;
  fVar163 = fVar89;
  fVar164 = fVar89;
  fVar165 = fVar89;
  fStack_2864 = fVar89;
  fStack_2868 = fVar89;
  fStack_286c = fVar89;
  fStack_2870 = fVar89;
  fStack_2874 = fVar89;
  fStack_2878 = fVar89;
  fStack_287c = fVar89;
  local_2880 = fVar89;
  local_2a48 = uVar54;
  fVar151 = fVar82;
  fVar147 = fVar82;
  fVar146 = fVar82;
  fVar145 = fVar82;
  fVar143 = fVar82;
  fVar142 = fVar82;
  fVar141 = fVar95;
  fVar140 = fVar95;
  fVar136 = fVar95;
  fVar80 = fVar95;
  fVar79 = fVar95;
  fVar78 = fVar95;
  fVar144 = fVar93;
  fVar98 = fVar93;
  fVar96 = fVar93;
  fVar94 = fVar93;
  fVar92 = fVar93;
  fVar90 = fVar93;
  fVar88 = fVar91;
  fVar70 = fVar91;
  fVar81 = fVar91;
  fVar100 = fVar91;
  fVar97 = fVar91;
  fVar99 = fVar91;
  uVar61 = local_29b8;
  uVar59 = local_29c0;
  uVar58 = local_29b0;
  uVar56 = local_29a8;
  uVar51 = local_29a0;
LAB_0169377d:
  do {
    do {
      if (pauVar55 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar48 = pauVar55 + -1;
      pauVar55 = pauVar55 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar48 + 8));
    uVar49 = *(ulong *)*pauVar55;
    while ((uVar49 & 8) == 0) {
      auVar64 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar51),auVar128._0_32_);
      auVar13._4_4_ = fVar97 * auVar64._4_4_;
      auVar13._0_4_ = fVar99 * auVar64._0_4_;
      auVar13._8_4_ = fVar100 * auVar64._8_4_;
      auVar13._12_4_ = fVar81 * auVar64._12_4_;
      auVar13._16_4_ = fVar70 * auVar64._16_4_;
      auVar13._20_4_ = fVar88 * auVar64._20_4_;
      auVar13._24_4_ = fVar91 * auVar64._24_4_;
      auVar13._28_4_ = auVar64._28_4_;
      auVar104 = auVar122._0_32_;
      auVar64 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar56),auVar104);
      auVar15._4_4_ = fVar92 * auVar64._4_4_;
      auVar15._0_4_ = fVar90 * auVar64._0_4_;
      auVar15._8_4_ = fVar94 * auVar64._8_4_;
      auVar15._12_4_ = fVar96 * auVar64._12_4_;
      auVar15._16_4_ = fVar98 * auVar64._16_4_;
      auVar15._20_4_ = fVar144 * auVar64._20_4_;
      auVar15._24_4_ = fVar93 * auVar64._24_4_;
      auVar15._28_4_ = auVar64._28_4_;
      auVar64 = vmaxps_avx(auVar13,auVar15);
      auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar58),auVar150._0_32_);
      auVar68._4_4_ = fVar79 * auVar84._4_4_;
      auVar68._0_4_ = fVar78 * auVar84._0_4_;
      auVar68._8_4_ = fVar80 * auVar84._8_4_;
      auVar68._12_4_ = fVar136 * auVar84._12_4_;
      auVar68._16_4_ = fVar140 * auVar84._16_4_;
      auVar68._20_4_ = fVar141 * auVar84._20_4_;
      auVar68._24_4_ = fVar95 * auVar84._24_4_;
      auVar68._28_4_ = auVar84._28_4_;
      auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar61),auVar128._0_32_);
      auVar16._4_4_ = auVar112._4_4_ * auVar84._4_4_;
      auVar16._0_4_ = auVar112._0_4_ * auVar84._0_4_;
      auVar16._8_4_ = auVar112._8_4_ * auVar84._8_4_;
      auVar16._12_4_ = auVar112._12_4_ * auVar84._12_4_;
      auVar16._16_4_ = auVar112._16_4_ * auVar84._16_4_;
      auVar16._20_4_ = auVar112._20_4_ * auVar84._20_4_;
      auVar16._24_4_ = auVar112._24_4_ * auVar84._24_4_;
      auVar16._28_4_ = auVar84._28_4_;
      auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar59),auVar104);
      auVar17._4_4_ = fVar143 * auVar84._4_4_;
      auVar17._0_4_ = fVar142 * auVar84._0_4_;
      auVar17._8_4_ = fVar145 * auVar84._8_4_;
      auVar17._12_4_ = fVar146 * auVar84._12_4_;
      auVar17._16_4_ = fVar147 * auVar84._16_4_;
      auVar17._20_4_ = fVar151 * auVar84._20_4_;
      auVar17._24_4_ = fVar82 * auVar84._24_4_;
      auVar17._28_4_ = auVar84._28_4_;
      auVar13 = vminps_avx(auVar16,auVar17);
      auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar54),auVar150._0_32_);
      auVar18._4_4_ = fVar160 * auVar84._4_4_;
      auVar18._0_4_ = fVar89 * auVar84._0_4_;
      auVar18._8_4_ = fVar161 * auVar84._8_4_;
      auVar18._12_4_ = fVar162 * auVar84._12_4_;
      auVar18._16_4_ = fVar163 * auVar84._16_4_;
      auVar18._20_4_ = fVar164 * auVar84._20_4_;
      auVar18._24_4_ = fVar165 * auVar84._24_4_;
      auVar18._28_4_ = auVar84._28_4_;
      auVar84 = vmaxps_avx(auVar68,auVar167._0_32_);
      local_2840 = vmaxps_avx(auVar64,auVar84);
      auVar64 = vminps_avx(auVar18,local_28c0);
      auVar64 = vminps_avx(auVar13,auVar64);
      auVar64 = vcmpps_avx(local_2840,auVar64,2);
      uVar43 = vmovmskps_avx(auVar64);
      if (uVar43 == 0) goto LAB_0169377d;
      uVar43 = uVar43 & 0xff;
      uVar60 = uVar49 & 0xfffffffffffffff0;
      lVar50 = 0;
      for (uVar49 = (ulong)uVar43; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
        lVar50 = lVar50 + 1;
      }
      uVar49 = *(ulong *)(uVar60 + lVar50 * 8);
      uVar43 = uVar43 - 1 & uVar43;
      uVar46 = (ulong)uVar43;
      if (uVar43 != 0) {
        uVar45 = *(uint *)(local_2840 + lVar50 * 4);
        lVar50 = 0;
        for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          lVar50 = lVar50 + 1;
        }
        uVar43 = uVar43 - 1 & uVar43;
        uVar47 = (ulong)uVar43;
        uVar46 = *(ulong *)(uVar60 + lVar50 * 8);
        uVar44 = *(uint *)(local_2840 + lVar50 * 4);
        uVar54 = local_2a48;
        if (uVar43 == 0) {
          if (uVar45 < uVar44) {
            *(ulong *)*pauVar55 = uVar46;
            *(uint *)(*pauVar55 + 8) = uVar44;
            pauVar55 = pauVar55 + 1;
          }
          else {
            *(ulong *)*pauVar55 = uVar49;
            *(uint *)(*pauVar55 + 8) = uVar45;
            pauVar55 = pauVar55 + 1;
            uVar49 = uVar46;
          }
        }
        else {
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar49;
          auVar62 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar45));
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar46;
          auVar71 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar44));
          lVar50 = 0;
          for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
            lVar50 = lVar50 + 1;
          }
          uVar43 = uVar43 - 1 & uVar43;
          uVar49 = (ulong)uVar43;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
          auVar63 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_2840 + lVar50 * 4)));
          auVar83 = vpcmpgtd_avx(auVar71,auVar62);
          if (uVar43 == 0) {
            auVar105 = vpshufd_avx(auVar83,0xaa);
            auVar83 = vblendvps_avx(auVar71,auVar62,auVar105);
            auVar62 = vblendvps_avx(auVar62,auVar71,auVar105);
            auVar71 = vpcmpgtd_avx(auVar63,auVar83);
            auVar105 = vpshufd_avx(auVar71,0xaa);
            auVar71 = vblendvps_avx(auVar63,auVar83,auVar105);
            auVar83 = vblendvps_avx(auVar83,auVar63,auVar105);
            auVar63 = vpcmpgtd_avx(auVar83,auVar62);
            auVar105 = vpshufd_avx(auVar63,0xaa);
            auVar63 = vblendvps_avx(auVar83,auVar62,auVar105);
            auVar62 = vblendvps_avx(auVar62,auVar83,auVar105);
            *pauVar55 = auVar62;
            pauVar55[1] = auVar63;
            uVar49 = auVar71._0_8_;
            pauVar55 = pauVar55 + 2;
            auVar112 = ZEXT3264(auVar112._0_32_);
          }
          else {
            lVar50 = 0;
            for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
              lVar50 = lVar50 + 1;
            }
            uVar43 = uVar43 - 1 & uVar43;
            uVar49 = (ulong)uVar43;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
            auVar105 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_2840 + lVar50 * 4)));
            if (uVar43 == 0) {
              auVar14 = vpshufd_avx(auVar83,0xaa);
              auVar83 = vblendvps_avx(auVar71,auVar62,auVar14);
              auVar62 = vblendvps_avx(auVar62,auVar71,auVar14);
              auVar71 = vpcmpgtd_avx(auVar105,auVar63);
              auVar14 = vpshufd_avx(auVar71,0xaa);
              auVar71 = vblendvps_avx(auVar105,auVar63,auVar14);
              auVar63 = vblendvps_avx(auVar63,auVar105,auVar14);
              auVar105 = vpcmpgtd_avx(auVar63,auVar62);
              auVar14 = vpshufd_avx(auVar105,0xaa);
              auVar105 = vblendvps_avx(auVar63,auVar62,auVar14);
              auVar62 = vblendvps_avx(auVar62,auVar63,auVar14);
              auVar63 = vpcmpgtd_avx(auVar71,auVar83);
              auVar14 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar71,auVar83,auVar14);
              auVar71 = vblendvps_avx(auVar83,auVar71,auVar14);
              auVar83 = vpcmpgtd_avx(auVar105,auVar71);
              auVar14 = vpshufd_avx(auVar83,0xaa);
              auVar83 = vblendvps_avx(auVar105,auVar71,auVar14);
              auVar71 = vblendvps_avx(auVar71,auVar105,auVar14);
              *pauVar55 = auVar62;
              pauVar55[1] = auVar71;
              pauVar55[2] = auVar83;
              uVar49 = auVar63._0_8_;
              pauVar48 = pauVar55 + 3;
            }
            else {
              *pauVar55 = auVar62;
              pauVar55[1] = auVar71;
              pauVar55[2] = auVar63;
              pauVar48 = pauVar55 + 3;
              pauVar55[3] = auVar105;
              do {
                lVar50 = 0;
                for (uVar46 = uVar49; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000)
                {
                  lVar50 = lVar50 + 1;
                }
                auVar63._8_8_ = 0;
                auVar63._0_8_ = *(ulong *)(uVar60 + lVar50 * 8);
                auVar62 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_2840 + lVar50 * 4)));
                pauVar48[1] = auVar62;
                pauVar48 = pauVar48 + 1;
                uVar49 = uVar49 - 1 & uVar49;
              } while (uVar49 != 0);
              lVar50 = 0;
              while (pauVar48 != pauVar55) {
                auVar62 = pauVar55[1];
                uVar43 = vextractps_avx(auVar62,2);
                for (lVar52 = 0x10;
                    (lVar50 != lVar52 && (*(uint *)(pauVar55[-1] + lVar52 + 8) < uVar43));
                    lVar52 = lVar52 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar55 + lVar52) =
                       *(undefined1 (*) [16])(pauVar55[-1] + lVar52);
                }
                *(undefined1 (*) [16])(*pauVar55 + lVar52) = auVar62;
                lVar50 = lVar50 + -0x10;
                pauVar55 = pauVar55 + 1;
              }
              uVar49 = *(ulong *)*pauVar48;
              auVar167 = ZEXT3264(local_28a0);
              fVar89 = local_2880;
              fVar160 = fStack_287c;
              fVar161 = fStack_2878;
              fVar162 = fStack_2874;
              fVar163 = fStack_2870;
              fVar164 = fStack_286c;
              fVar165 = fStack_2868;
            }
            auVar122 = ZEXT3264(auVar104);
            auVar112 = ZEXT3264(auVar112._0_32_);
            pauVar55 = pauVar48;
          }
        }
      }
    }
    local_29d0 = (ulong)((uint)uVar49 & 0xf) - 8;
    uVar49 = uVar49 & 0xfffffffffffffff0;
    local_2998 = pauVar55;
    for (local_29c8 = 0; local_29c8 != local_29d0; local_29c8 = local_29c8 + 1) {
      lVar50 = local_29c8 * 0x90;
      uVar1 = *(undefined4 *)(uVar49 + 0x70 + lVar50);
      auVar85._4_4_ = uVar1;
      auVar85._0_4_ = uVar1;
      auVar85._8_4_ = uVar1;
      auVar85._12_4_ = uVar1;
      auVar85._16_4_ = uVar1;
      auVar85._20_4_ = uVar1;
      auVar85._24_4_ = uVar1;
      auVar85._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar49 + 0x7c + lVar50);
      auVar102._4_4_ = uVar1;
      auVar102._0_4_ = uVar1;
      auVar102._8_4_ = uVar1;
      auVar102._12_4_ = uVar1;
      auVar102._16_4_ = uVar1;
      auVar102._20_4_ = uVar1;
      auVar102._24_4_ = uVar1;
      auVar102._28_4_ = uVar1;
      local_2990 = lVar50 + uVar49;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(local_29d8 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar14);
      auVar64 = vcvtdq2ps_avx(auVar64);
      auVar83 = vfmadd213ps_fma(auVar64,auVar102,auVar85);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(local_29e0 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar4);
      auVar64 = vcvtdq2ps_avx(auVar64);
      uVar1 = *(undefined4 *)(uVar49 + 0x74 + lVar50);
      auVar106._4_4_ = uVar1;
      auVar106._0_4_ = uVar1;
      auVar106._8_4_ = uVar1;
      auVar106._12_4_ = uVar1;
      auVar106._16_4_ = uVar1;
      auVar106._20_4_ = uVar1;
      auVar106._24_4_ = uVar1;
      auVar106._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar49 + 0x80 + lVar50);
      auVar115._4_4_ = uVar1;
      auVar115._0_4_ = uVar1;
      auVar115._8_4_ = uVar1;
      auVar115._12_4_ = uVar1;
      auVar115._16_4_ = uVar1;
      auVar115._20_4_ = uVar1;
      auVar115._24_4_ = uVar1;
      auVar115._28_4_ = uVar1;
      auVar63 = vfmadd213ps_fma(auVar64,auVar102,auVar85);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_29e8 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar5);
      auVar64 = vcvtdq2ps_avx(auVar64);
      auVar105 = vfmadd213ps_fma(auVar64,auVar115,auVar106);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(local_29f0 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar6);
      auVar64 = vcvtdq2ps_avx(auVar64);
      uVar1 = *(undefined4 *)(uVar49 + 0x78 + lVar50);
      auVar124._4_4_ = uVar1;
      auVar124._0_4_ = uVar1;
      auVar124._8_4_ = uVar1;
      auVar124._12_4_ = uVar1;
      auVar124._16_4_ = uVar1;
      auVar124._20_4_ = uVar1;
      auVar124._24_4_ = uVar1;
      auVar124._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar49 + 0x84 + lVar50);
      auVar130._4_4_ = uVar1;
      auVar130._0_4_ = uVar1;
      auVar130._8_4_ = uVar1;
      auVar130._12_4_ = uVar1;
      auVar130._16_4_ = uVar1;
      auVar130._20_4_ = uVar1;
      auVar130._24_4_ = uVar1;
      auVar130._28_4_ = uVar1;
      auVar14 = vfmadd213ps_fma(auVar64,auVar115,auVar106);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_29f8 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar7);
      auVar64 = vcvtdq2ps_avx(auVar64);
      auVar4 = vfmadd213ps_fma(auVar64,auVar130,auVar124);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(local_2a00 + 0x40 + local_2990);
      auVar64 = vpmovzxbd_avx2(auVar8);
      auVar64 = vcvtdq2ps_avx(auVar64);
      auVar5 = vfmadd213ps_fma(auVar64,auVar130,auVar124);
      auVar123._8_8_ = 0;
      auVar123._0_8_ = *(ulong *)(uVar49 + 0x40 + lVar50);
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)(uVar49 + 0x48 + lVar50);
      auVar62 = vpminub_avx(auVar123,auVar129);
      auVar71 = vpcmpeqb_avx(auVar123,auVar62);
      auVar64 = vsubps_avx(ZEXT1632(auVar83),auVar128._0_32_);
      auVar104._4_4_ = fVar97 * auVar64._4_4_;
      auVar104._0_4_ = fVar99 * auVar64._0_4_;
      auVar104._8_4_ = fVar100 * auVar64._8_4_;
      auVar104._12_4_ = fVar81 * auVar64._12_4_;
      auVar104._16_4_ = fVar70 * auVar64._16_4_;
      auVar104._20_4_ = fVar88 * auVar64._20_4_;
      auVar104._24_4_ = fVar91 * auVar64._24_4_;
      auVar104._28_4_ = auVar64._28_4_;
      auVar64 = vsubps_avx(ZEXT1632(auVar105),auVar122._0_32_);
      auVar166._4_4_ = fVar92 * auVar64._4_4_;
      auVar166._0_4_ = fVar90 * auVar64._0_4_;
      auVar166._8_4_ = fVar94 * auVar64._8_4_;
      auVar166._12_4_ = fVar96 * auVar64._12_4_;
      auVar166._16_4_ = fVar98 * auVar64._16_4_;
      auVar166._20_4_ = fVar144 * auVar64._20_4_;
      auVar166._24_4_ = fVar93 * auVar64._24_4_;
      auVar166._28_4_ = auVar64._28_4_;
      auVar64 = vmaxps_avx(auVar104,auVar166);
      auVar84 = vsubps_avx(ZEXT1632(auVar63),auVar128._0_32_);
      auVar19._4_4_ = auVar112._4_4_ * auVar84._4_4_;
      auVar19._0_4_ = auVar112._0_4_ * auVar84._0_4_;
      auVar19._8_4_ = auVar112._8_4_ * auVar84._8_4_;
      auVar19._12_4_ = auVar112._12_4_ * auVar84._12_4_;
      auVar19._16_4_ = auVar112._16_4_ * auVar84._16_4_;
      auVar19._20_4_ = auVar112._20_4_ * auVar84._20_4_;
      auVar19._24_4_ = auVar112._24_4_ * auVar84._24_4_;
      auVar19._28_4_ = auVar84._28_4_;
      auVar167 = ZEXT3264(local_28a0);
      auVar84 = vsubps_avx(ZEXT1632(auVar14),auVar122._0_32_);
      auVar20._4_4_ = fVar143 * auVar84._4_4_;
      auVar20._0_4_ = fVar142 * auVar84._0_4_;
      auVar20._8_4_ = fVar145 * auVar84._8_4_;
      auVar20._12_4_ = fVar146 * auVar84._12_4_;
      auVar20._16_4_ = fVar147 * auVar84._16_4_;
      auVar20._20_4_ = fVar151 * auVar84._20_4_;
      auVar20._24_4_ = fVar82 * auVar84._24_4_;
      auVar20._28_4_ = auVar84._28_4_;
      auVar13 = vminps_avx(auVar19,auVar20);
      auVar84 = vsubps_avx(ZEXT1632(auVar4),auVar150._0_32_);
      auVar21._4_4_ = fVar79 * auVar84._4_4_;
      auVar21._0_4_ = fVar78 * auVar84._0_4_;
      auVar21._8_4_ = fVar80 * auVar84._8_4_;
      auVar21._12_4_ = fVar136 * auVar84._12_4_;
      auVar21._16_4_ = fVar140 * auVar84._16_4_;
      auVar21._20_4_ = fVar141 * auVar84._20_4_;
      auVar21._24_4_ = fVar95 * auVar84._24_4_;
      auVar21._28_4_ = auVar84._28_4_;
      auVar84 = vmaxps_avx(auVar21,local_28a0);
      local_23c0 = vmaxps_avx(auVar64,auVar84);
      auVar64 = vsubps_avx(ZEXT1632(auVar5),auVar150._0_32_);
      auVar22._4_4_ = fStack_287c * auVar64._4_4_;
      auVar22._0_4_ = local_2880 * auVar64._0_4_;
      auVar22._8_4_ = fStack_2878 * auVar64._8_4_;
      auVar22._12_4_ = fStack_2874 * auVar64._12_4_;
      auVar22._16_4_ = fStack_2870 * auVar64._16_4_;
      auVar22._20_4_ = fStack_286c * auVar64._20_4_;
      auVar22._24_4_ = fStack_2868 * auVar64._24_4_;
      auVar22._28_4_ = auVar64._28_4_;
      auVar64 = vminps_avx(auVar22,local_28c0);
      auVar64 = vminps_avx(auVar13,auVar64);
      auVar64 = vcmpps_avx(local_23c0,auVar64,2);
      auVar62 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
      auVar71 = vpmovzxbw_avx(auVar71);
      auVar62 = vpand_avx(auVar62,auVar71);
      auVar62 = vpshufb_avx(auVar62,_DAT_01fb8680);
      local_2978 = (ulong)(byte)(SUB161(auVar62 >> 7,0) & 1 | (SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar62 >> 0x3f,0) << 7);
      fVar89 = local_2880;
      fVar160 = fStack_287c;
      fVar161 = fStack_2878;
      fVar162 = fStack_2874;
      fVar163 = fStack_2870;
      fVar164 = fStack_286c;
      fVar165 = fStack_2868;
      while (local_2978 != 0) {
        lVar50 = 0;
        for (uVar60 = local_2978; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          lVar50 = lVar50 + 1;
        }
        local_2978 = local_2978 - 1 & local_2978;
        fVar99 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)(local_23c0 + lVar50 * 4) <= fVar99) {
          uVar9 = *(ushort *)(local_2990 + lVar50 * 8);
          uVar10 = *(ushort *)(local_2990 + 2 + lVar50 * 8);
          local_2920._4_4_ = *(uint *)(local_2990 + 0x88);
          uVar43 = *(uint *)(local_2990 + 4 + lVar50 * 8);
          local_2a38 = (ulong)uVar43;
          local_2980 = context->scene;
          pGVar11 = (local_2980->geometries).items[(uint)local_2920._4_4_].ptr;
          local_2988 = *(long *)&pGVar11->field_0x58;
          lVar57 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   local_2a38;
          local_2a3c = uVar9 & 0x7fff;
          local_2a40 = uVar10 & 0x7fff;
          uVar45 = *(uint *)(local_2988 + 4 + lVar57);
          uVar56 = (ulong)uVar45;
          uVar51 = (ulong)(uVar45 * local_2a40 + *(int *)(local_2988 + lVar57) + local_2a3c);
          lVar50 = *(long *)&pGVar11[1].time_range.upper;
          p_Var12 = pGVar11[1].intersectionFilterN;
          auVar62 = *(undefined1 (*) [16])(lVar50 + (uVar51 + 1) * (long)p_Var12);
          auVar71 = *(undefined1 (*) [16])(lVar50 + (uVar51 + uVar56) * (long)p_Var12);
          lVar52 = uVar51 + uVar56 + 1;
          auVar83 = *(undefined1 (*) [16])(lVar50 + lVar52 * (long)p_Var12);
          auVar63 = *(undefined1 (*) [16])
                     (lVar50 + (uVar51 + (-1 < (short)uVar9) + 1) * (long)p_Var12);
          lVar53 = (ulong)(-1 < (short)uVar9) + lVar52;
          uVar54 = 0;
          if (-1 < (short)uVar10) {
            uVar54 = uVar56;
          }
          auVar105 = *(undefined1 (*) [16])(lVar50 + lVar53 * (long)p_Var12);
          auVar14 = *(undefined1 (*) [16])(lVar50 + (uVar51 + uVar56 + uVar54) * (long)p_Var12);
          auVar4 = *(undefined1 (*) [16])(lVar50 + (lVar52 + uVar54) * (long)p_Var12);
          auVar133._16_16_ = *(undefined1 (*) [16])(lVar50 + (uVar54 + lVar53) * (long)p_Var12);
          auVar133._0_16_ = auVar83;
          auVar6 = vunpcklps_avx(auVar62,auVar105);
          auVar5 = vunpckhps_avx(auVar62,auVar105);
          auVar7 = vunpcklps_avx(auVar63,auVar83);
          auVar63 = vunpckhps_avx(auVar63,auVar83);
          auVar8 = vunpcklps_avx(auVar5,auVar63);
          auVar123 = vunpcklps_avx(auVar6,auVar7);
          auVar63 = vunpckhps_avx(auVar6,auVar7);
          auVar6 = vunpcklps_avx(auVar71,auVar4);
          auVar5 = vunpckhps_avx(auVar71,auVar4);
          auVar7 = vunpcklps_avx(auVar83,auVar14);
          auVar14 = vunpckhps_avx(auVar83,auVar14);
          auVar5 = vunpcklps_avx(auVar5,auVar14);
          auVar129 = vunpcklps_avx(auVar6,auVar7);
          auVar14 = vunpckhps_avx(auVar6,auVar7);
          auVar86._16_16_ = auVar4;
          auVar86._0_16_ = auVar71;
          auVar73._16_16_ = auVar105;
          auVar73._0_16_ = auVar62;
          auVar64 = vunpcklps_avx(auVar73,auVar86);
          auVar65._16_16_ = auVar83;
          auVar65._0_16_ = *(undefined1 (*) [16])(lVar50 + (long)p_Var12 * uVar51);
          auVar84 = vunpcklps_avx(auVar65,auVar133);
          auVar18 = vunpcklps_avx(auVar84,auVar64);
          auVar64 = vunpckhps_avx(auVar84,auVar64);
          auVar84 = vunpckhps_avx(auVar73,auVar86);
          auVar13 = vunpckhps_avx(auVar65,auVar133);
          auVar84 = vunpcklps_avx(auVar13,auVar84);
          auVar74._16_16_ = auVar123;
          auVar74._0_16_ = auVar123;
          auVar107._16_16_ = auVar63;
          auVar107._0_16_ = auVar63;
          auVar116._16_16_ = auVar8;
          auVar116._0_16_ = auVar8;
          auVar134._16_16_ = auVar129;
          auVar134._0_16_ = auVar129;
          auVar137._16_16_ = auVar14;
          auVar137._0_16_ = auVar14;
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar148._4_4_ = uVar1;
          auVar148._0_4_ = uVar1;
          auVar148._8_4_ = uVar1;
          auVar148._12_4_ = uVar1;
          auVar148._16_4_ = uVar1;
          auVar148._20_4_ = uVar1;
          auVar148._24_4_ = uVar1;
          auVar148._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar157._4_4_ = uVar1;
          auVar157._0_4_ = uVar1;
          auVar157._8_4_ = uVar1;
          auVar157._12_4_ = uVar1;
          auVar157._16_4_ = uVar1;
          auVar157._20_4_ = uVar1;
          auVar157._24_4_ = uVar1;
          auVar157._28_4_ = uVar1;
          auVar125._16_16_ = auVar5;
          auVar125._0_16_ = auVar5;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar158._4_4_ = uVar1;
          auVar158._0_4_ = uVar1;
          auVar158._8_4_ = uVar1;
          auVar158._12_4_ = uVar1;
          auVar158._16_4_ = uVar1;
          auVar158._20_4_ = uVar1;
          auVar158._24_4_ = uVar1;
          auVar158._28_4_ = uVar1;
          auVar15 = vsubps_avx(auVar18,auVar148);
          local_23e0 = vsubps_avx(auVar64,auVar157);
          local_2400 = vsubps_avx(auVar84,auVar158);
          auVar64 = vsubps_avx(auVar74,auVar148);
          auVar84 = vsubps_avx(auVar107,auVar157);
          auVar13 = vsubps_avx(auVar116,auVar158);
          auVar68 = vsubps_avx(auVar134,auVar148);
          auVar16 = vsubps_avx(auVar137,auVar157);
          auVar17 = vsubps_avx(auVar125,auVar158);
          local_2420 = vsubps_avx(auVar68,auVar15);
          local_2460 = vsubps_avx(auVar16,local_23e0);
          local_2440 = vsubps_avx(auVar17,local_2400);
          auVar66._0_4_ = auVar15._0_4_ + auVar68._0_4_;
          auVar66._4_4_ = auVar15._4_4_ + auVar68._4_4_;
          auVar66._8_4_ = auVar15._8_4_ + auVar68._8_4_;
          auVar66._12_4_ = auVar15._12_4_ + auVar68._12_4_;
          auVar66._16_4_ = auVar15._16_4_ + auVar68._16_4_;
          auVar66._20_4_ = auVar15._20_4_ + auVar68._20_4_;
          auVar66._24_4_ = auVar15._24_4_ + auVar68._24_4_;
          fVar79 = auVar15._28_4_;
          auVar66._28_4_ = fVar79 + auVar68._28_4_;
          auVar103._0_4_ = auVar16._0_4_ + local_23e0._0_4_;
          auVar103._4_4_ = auVar16._4_4_ + local_23e0._4_4_;
          auVar103._8_4_ = auVar16._8_4_ + local_23e0._8_4_;
          auVar103._12_4_ = auVar16._12_4_ + local_23e0._12_4_;
          auVar103._16_4_ = auVar16._16_4_ + local_23e0._16_4_;
          auVar103._20_4_ = auVar16._20_4_ + local_23e0._20_4_;
          auVar103._24_4_ = auVar16._24_4_ + local_23e0._24_4_;
          auVar103._28_4_ = auVar16._28_4_ + local_23e0._28_4_;
          fVar82 = local_2400._0_4_;
          auVar126._0_4_ = auVar17._0_4_ + fVar82;
          fVar89 = local_2400._4_4_;
          auVar126._4_4_ = auVar17._4_4_ + fVar89;
          fVar91 = local_2400._8_4_;
          auVar126._8_4_ = auVar17._8_4_ + fVar91;
          fVar93 = local_2400._12_4_;
          auVar126._12_4_ = auVar17._12_4_ + fVar93;
          fVar95 = local_2400._16_4_;
          auVar126._16_4_ = auVar17._16_4_ + fVar95;
          fVar97 = local_2400._20_4_;
          auVar126._20_4_ = auVar17._20_4_ + fVar97;
          fVar100 = local_2400._24_4_;
          auVar126._24_4_ = auVar17._24_4_ + fVar100;
          fVar81 = local_2400._28_4_;
          auVar126._28_4_ = auVar17._28_4_ + fVar81;
          auVar23._4_4_ = local_2440._4_4_ * auVar103._4_4_;
          auVar23._0_4_ = local_2440._0_4_ * auVar103._0_4_;
          auVar23._8_4_ = local_2440._8_4_ * auVar103._8_4_;
          auVar23._12_4_ = local_2440._12_4_ * auVar103._12_4_;
          auVar23._16_4_ = local_2440._16_4_ * auVar103._16_4_;
          auVar23._20_4_ = local_2440._20_4_ * auVar103._20_4_;
          auVar23._24_4_ = local_2440._24_4_ * auVar103._24_4_;
          auVar23._28_4_ = auVar18._28_4_;
          auVar71 = vfmsub231ps_fma(auVar23,local_2460,auVar126);
          auVar24._4_4_ = local_2420._4_4_ * auVar126._4_4_;
          auVar24._0_4_ = local_2420._0_4_ * auVar126._0_4_;
          auVar24._8_4_ = local_2420._8_4_ * auVar126._8_4_;
          auVar24._12_4_ = local_2420._12_4_ * auVar126._12_4_;
          auVar24._16_4_ = local_2420._16_4_ * auVar126._16_4_;
          auVar24._20_4_ = local_2420._20_4_ * auVar126._20_4_;
          auVar24._24_4_ = local_2420._24_4_ * auVar126._24_4_;
          auVar24._28_4_ = auVar126._28_4_;
          auVar62 = vfmsub231ps_fma(auVar24,local_2440,auVar66);
          auVar25._4_4_ = local_2460._4_4_ * auVar66._4_4_;
          auVar25._0_4_ = local_2460._0_4_ * auVar66._0_4_;
          auVar25._8_4_ = local_2460._8_4_ * auVar66._8_4_;
          auVar25._12_4_ = local_2460._12_4_ * auVar66._12_4_;
          auVar25._16_4_ = local_2460._16_4_ * auVar66._16_4_;
          auVar25._20_4_ = local_2460._20_4_ * auVar66._20_4_;
          auVar25._24_4_ = local_2460._24_4_ * auVar66._24_4_;
          auVar25._28_4_ = auVar66._28_4_;
          auVar83 = vfmsub231ps_fma(auVar25,local_2420,auVar103);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          local_2940._4_4_ = *(float *)(ray + k * 4 + 0x60);
          auVar26._4_4_ = local_2940._4_4_ * auVar83._4_4_;
          auVar26._0_4_ = local_2940._4_4_ * auVar83._0_4_;
          auVar26._8_4_ = local_2940._4_4_ * auVar83._8_4_;
          auVar26._12_4_ = local_2940._4_4_ * auVar83._12_4_;
          auVar26._16_4_ = local_2940._4_4_ * 0.0;
          auVar26._20_4_ = local_2940._4_4_ * 0.0;
          auVar26._24_4_ = local_2940._4_4_ * 0.0;
          auVar26._28_4_ = auVar103._28_4_;
          auVar62 = vfmadd231ps_fma(auVar26,auVar108,ZEXT1632(auVar62));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar159._4_4_ = uVar1;
          auVar159._0_4_ = uVar1;
          auVar159._8_4_ = uVar1;
          auVar159._12_4_ = uVar1;
          auVar159._16_4_ = uVar1;
          auVar159._20_4_ = uVar1;
          auVar159._24_4_ = uVar1;
          auVar159._28_4_ = uVar1;
          auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar159,ZEXT1632(auVar71));
          local_2480 = vsubps_avx(local_23e0,auVar84);
          local_24a0 = vsubps_avx(local_2400,auVar13);
          auVar127._0_4_ = local_23e0._0_4_ + auVar84._0_4_;
          auVar127._4_4_ = local_23e0._4_4_ + auVar84._4_4_;
          auVar127._8_4_ = local_23e0._8_4_ + auVar84._8_4_;
          auVar127._12_4_ = local_23e0._12_4_ + auVar84._12_4_;
          auVar127._16_4_ = local_23e0._16_4_ + auVar84._16_4_;
          auVar127._20_4_ = local_23e0._20_4_ + auVar84._20_4_;
          auVar127._24_4_ = local_23e0._24_4_ + auVar84._24_4_;
          fVar70 = auVar84._28_4_;
          auVar127._28_4_ = local_23e0._28_4_ + fVar70;
          auVar131._0_4_ = auVar13._0_4_ + fVar82;
          auVar131._4_4_ = auVar13._4_4_ + fVar89;
          auVar131._8_4_ = auVar13._8_4_ + fVar91;
          auVar131._12_4_ = auVar13._12_4_ + fVar93;
          auVar131._16_4_ = auVar13._16_4_ + fVar95;
          auVar131._20_4_ = auVar13._20_4_ + fVar97;
          auVar131._24_4_ = auVar13._24_4_ + fVar100;
          fVar78 = auVar13._28_4_;
          auVar131._28_4_ = fVar78 + fVar81;
          fVar136 = local_24a0._0_4_;
          fVar140 = local_24a0._4_4_;
          auVar27._4_4_ = fVar140 * auVar127._4_4_;
          auVar27._0_4_ = fVar136 * auVar127._0_4_;
          fVar141 = local_24a0._8_4_;
          auVar27._8_4_ = fVar141 * auVar127._8_4_;
          fVar142 = local_24a0._12_4_;
          auVar27._12_4_ = fVar142 * auVar127._12_4_;
          fVar143 = local_24a0._16_4_;
          auVar27._16_4_ = fVar143 * auVar127._16_4_;
          fVar145 = local_24a0._20_4_;
          auVar27._20_4_ = fVar145 * auVar127._20_4_;
          fVar146 = local_24a0._24_4_;
          auVar27._24_4_ = fVar146 * auVar127._24_4_;
          auVar27._28_4_ = fVar81;
          auVar83 = vfmsub231ps_fma(auVar27,local_2480,auVar131);
          local_24c0 = vsubps_avx(auVar15,auVar64);
          fVar81 = local_24c0._0_4_;
          fVar90 = local_24c0._4_4_;
          auVar28._4_4_ = auVar131._4_4_ * fVar90;
          auVar28._0_4_ = auVar131._0_4_ * fVar81;
          fVar94 = local_24c0._8_4_;
          auVar28._8_4_ = auVar131._8_4_ * fVar94;
          fVar98 = local_24c0._12_4_;
          auVar28._12_4_ = auVar131._12_4_ * fVar98;
          fVar160 = local_24c0._16_4_;
          auVar28._16_4_ = auVar131._16_4_ * fVar160;
          fVar162 = local_24c0._20_4_;
          auVar28._20_4_ = auVar131._20_4_ * fVar162;
          fVar164 = local_24c0._24_4_;
          auVar28._24_4_ = auVar131._24_4_ * fVar164;
          auVar28._28_4_ = fVar78;
          auVar132._0_4_ = auVar15._0_4_ + auVar64._0_4_;
          auVar132._4_4_ = auVar15._4_4_ + auVar64._4_4_;
          auVar132._8_4_ = auVar15._8_4_ + auVar64._8_4_;
          auVar132._12_4_ = auVar15._12_4_ + auVar64._12_4_;
          auVar132._16_4_ = auVar15._16_4_ + auVar64._16_4_;
          auVar132._20_4_ = auVar15._20_4_ + auVar64._20_4_;
          auVar132._24_4_ = auVar15._24_4_ + auVar64._24_4_;
          auVar132._28_4_ = fVar79 + auVar64._28_4_;
          auVar71 = vfmsub231ps_fma(auVar28,local_24a0,auVar132);
          fVar88 = local_2480._0_4_;
          fVar92 = local_2480._4_4_;
          auVar29._4_4_ = auVar132._4_4_ * fVar92;
          auVar29._0_4_ = auVar132._0_4_ * fVar88;
          fVar96 = local_2480._8_4_;
          auVar29._8_4_ = auVar132._8_4_ * fVar96;
          fVar144 = local_2480._12_4_;
          auVar29._12_4_ = auVar132._12_4_ * fVar144;
          fVar161 = local_2480._16_4_;
          auVar29._16_4_ = auVar132._16_4_ * fVar161;
          fVar163 = local_2480._20_4_;
          auVar29._20_4_ = auVar132._20_4_ * fVar163;
          fVar165 = local_2480._24_4_;
          auVar29._24_4_ = auVar132._24_4_ * fVar165;
          auVar29._28_4_ = auVar132._28_4_;
          auVar63 = vfmsub231ps_fma(auVar29,local_24c0,auVar127);
          auVar30._4_4_ = local_2940._4_4_ * auVar63._4_4_;
          auVar30._0_4_ = local_2940._4_4_ * auVar63._0_4_;
          auVar30._8_4_ = local_2940._4_4_ * auVar63._8_4_;
          auVar30._12_4_ = local_2940._4_4_ * auVar63._12_4_;
          auVar30._16_4_ = local_2940._4_4_ * 0.0;
          auVar30._20_4_ = local_2940._4_4_ * 0.0;
          auVar30._24_4_ = local_2940._4_4_ * 0.0;
          auVar30._28_4_ = fVar79;
          auVar71 = vfmadd231ps_fma(auVar30,auVar108,ZEXT1632(auVar71));
          auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar159,ZEXT1632(auVar83));
          auVar18 = vsubps_avx(auVar64,auVar68);
          auVar117._0_4_ = auVar64._0_4_ + auVar68._0_4_;
          auVar117._4_4_ = auVar64._4_4_ + auVar68._4_4_;
          auVar117._8_4_ = auVar64._8_4_ + auVar68._8_4_;
          auVar117._12_4_ = auVar64._12_4_ + auVar68._12_4_;
          auVar117._16_4_ = auVar64._16_4_ + auVar68._16_4_;
          auVar117._20_4_ = auVar64._20_4_ + auVar68._20_4_;
          auVar117._24_4_ = auVar64._24_4_ + auVar68._24_4_;
          auVar117._28_4_ = auVar64._28_4_ + auVar68._28_4_;
          auVar68 = vsubps_avx(auVar84,auVar16);
          auVar135._0_4_ = auVar16._0_4_ + auVar84._0_4_;
          auVar135._4_4_ = auVar16._4_4_ + auVar84._4_4_;
          auVar135._8_4_ = auVar16._8_4_ + auVar84._8_4_;
          auVar135._12_4_ = auVar16._12_4_ + auVar84._12_4_;
          auVar135._16_4_ = auVar16._16_4_ + auVar84._16_4_;
          auVar135._20_4_ = auVar16._20_4_ + auVar84._20_4_;
          auVar135._24_4_ = auVar16._24_4_ + auVar84._24_4_;
          auVar135._28_4_ = auVar16._28_4_ + fVar70;
          auVar16 = vsubps_avx(auVar13,auVar17);
          auVar75._0_4_ = auVar13._0_4_ + auVar17._0_4_;
          auVar75._4_4_ = auVar13._4_4_ + auVar17._4_4_;
          auVar75._8_4_ = auVar13._8_4_ + auVar17._8_4_;
          auVar75._12_4_ = auVar13._12_4_ + auVar17._12_4_;
          auVar75._16_4_ = auVar13._16_4_ + auVar17._16_4_;
          auVar75._20_4_ = auVar13._20_4_ + auVar17._20_4_;
          auVar75._24_4_ = auVar13._24_4_ + auVar17._24_4_;
          auVar75._28_4_ = fVar78 + auVar17._28_4_;
          auVar31._4_4_ = auVar135._4_4_ * auVar16._4_4_;
          auVar31._0_4_ = auVar135._0_4_ * auVar16._0_4_;
          auVar31._8_4_ = auVar135._8_4_ * auVar16._8_4_;
          auVar31._12_4_ = auVar135._12_4_ * auVar16._12_4_;
          auVar31._16_4_ = auVar135._16_4_ * auVar16._16_4_;
          auVar31._20_4_ = auVar135._20_4_ * auVar16._20_4_;
          auVar31._24_4_ = auVar135._24_4_ * auVar16._24_4_;
          auVar31._28_4_ = fVar70;
          auVar63 = vfmsub231ps_fma(auVar31,auVar68,auVar75);
          auVar32._4_4_ = auVar75._4_4_ * auVar18._4_4_;
          auVar32._0_4_ = auVar75._0_4_ * auVar18._0_4_;
          auVar32._8_4_ = auVar75._8_4_ * auVar18._8_4_;
          auVar32._12_4_ = auVar75._12_4_ * auVar18._12_4_;
          auVar32._16_4_ = auVar75._16_4_ * auVar18._16_4_;
          auVar32._20_4_ = auVar75._20_4_ * auVar18._20_4_;
          auVar32._24_4_ = auVar75._24_4_ * auVar18._24_4_;
          auVar32._28_4_ = auVar75._28_4_;
          auVar83 = vfmsub231ps_fma(auVar32,auVar16,auVar117);
          auVar33._4_4_ = auVar117._4_4_ * auVar68._4_4_;
          auVar33._0_4_ = auVar117._0_4_ * auVar68._0_4_;
          auVar33._8_4_ = auVar117._8_4_ * auVar68._8_4_;
          auVar33._12_4_ = auVar117._12_4_ * auVar68._12_4_;
          auVar33._16_4_ = auVar117._16_4_ * auVar68._16_4_;
          auVar33._20_4_ = auVar117._20_4_ * auVar68._20_4_;
          auVar33._24_4_ = auVar117._24_4_ * auVar68._24_4_;
          auVar33._28_4_ = auVar117._28_4_;
          auVar105 = vfmsub231ps_fma(auVar33,auVar18,auVar135);
          local_2940._0_4_ = local_2940._4_4_;
          uStack_2938._0_4_ = local_2940._4_4_;
          uStack_2938._4_4_ = local_2940._4_4_;
          fStack_2930 = local_2940._4_4_;
          fStack_292c = local_2940._4_4_;
          fStack_2928 = local_2940._4_4_;
          fStack_2924 = local_2940._4_4_;
          auVar17 = _local_2940;
          auVar118._0_4_ = local_2940._4_4_ * auVar105._0_4_;
          auVar118._4_4_ = local_2940._4_4_ * auVar105._4_4_;
          auVar118._8_4_ = local_2940._4_4_ * auVar105._8_4_;
          auVar118._12_4_ = local_2940._4_4_ * auVar105._12_4_;
          auVar118._16_4_ = local_2940._4_4_ * 0.0;
          auVar118._20_4_ = local_2940._4_4_ * 0.0;
          auVar118._24_4_ = local_2940._4_4_ * 0.0;
          auVar118._28_4_ = 0;
          auVar83 = vfmadd231ps_fma(auVar118,auVar108,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar159,ZEXT1632(auVar63));
          fVar70 = auVar83._0_4_ + auVar71._0_4_ + auVar62._0_4_;
          fVar78 = auVar83._4_4_ + auVar71._4_4_ + auVar62._4_4_;
          fVar79 = auVar83._8_4_ + auVar71._8_4_ + auVar62._8_4_;
          fVar80 = auVar83._12_4_ + auVar71._12_4_ + auVar62._12_4_;
          local_24e0 = ZEXT1632(CONCAT412(fVar80,CONCAT48(fVar79,CONCAT44(fVar78,fVar70))));
          auVar109._8_4_ = 0x7fffffff;
          auVar109._0_8_ = 0x7fffffff7fffffff;
          auVar109._12_4_ = 0x7fffffff;
          auVar109._16_4_ = 0x7fffffff;
          auVar109._20_4_ = 0x7fffffff;
          auVar109._24_4_ = 0x7fffffff;
          auVar109._28_4_ = 0x7fffffff;
          auVar166 = ZEXT1632(auVar71);
          auVar64 = vminps_avx(ZEXT1632(auVar62),auVar166);
          auVar64 = vminps_avx(auVar64,ZEXT1632(auVar83));
          local_2500 = vandps_avx(local_24e0,auVar109);
          fVar147 = local_2500._0_4_ * 1.1920929e-07;
          fVar151 = local_2500._4_4_ * 1.1920929e-07;
          auVar34._4_4_ = fVar151;
          auVar34._0_4_ = fVar147;
          fVar152 = local_2500._8_4_ * 1.1920929e-07;
          auVar34._8_4_ = fVar152;
          fVar153 = local_2500._12_4_ * 1.1920929e-07;
          auVar34._12_4_ = fVar153;
          fVar154 = local_2500._16_4_ * 1.1920929e-07;
          auVar34._16_4_ = fVar154;
          fVar155 = local_2500._20_4_ * 1.1920929e-07;
          auVar34._20_4_ = fVar155;
          fVar156 = local_2500._24_4_ * 1.1920929e-07;
          auVar34._24_4_ = fVar156;
          auVar34._28_4_ = 0x34000000;
          auVar138._0_8_ = CONCAT44(fVar151,fVar147) ^ 0x8000000080000000;
          auVar138._8_4_ = -fVar152;
          auVar138._12_4_ = -fVar153;
          auVar138._16_4_ = -fVar154;
          auVar138._20_4_ = -fVar155;
          auVar138._24_4_ = -fVar156;
          auVar138._28_4_ = 0xb4000000;
          auVar64 = vcmpps_avx(auVar64,auVar138,5);
          auVar104 = ZEXT1632(auVar62);
          auVar13 = vmaxps_avx(auVar104,auVar166);
          auVar84 = vmaxps_avx(auVar13,ZEXT1632(auVar83));
          auVar84 = vcmpps_avx(auVar84,auVar34,2);
          auVar84 = vorps_avx(auVar64,auVar84);
          if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar84 >> 0x7f,0) != '\0') ||
                (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar84 >> 0xbf,0) != '\0') ||
              (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar84[0x1f] < '\0') {
            auVar35._4_4_ = local_2440._4_4_ * fVar92;
            auVar35._0_4_ = local_2440._0_4_ * fVar88;
            auVar35._8_4_ = local_2440._8_4_ * fVar96;
            auVar35._12_4_ = local_2440._12_4_ * fVar144;
            auVar35._16_4_ = local_2440._16_4_ * fVar161;
            auVar35._20_4_ = local_2440._20_4_ * fVar163;
            auVar35._24_4_ = local_2440._24_4_ * fVar165;
            auVar35._28_4_ = auVar64._28_4_;
            auVar36._4_4_ = fVar90 * local_2460._4_4_;
            auVar36._0_4_ = fVar81 * local_2460._0_4_;
            auVar36._8_4_ = fVar94 * local_2460._8_4_;
            auVar36._12_4_ = fVar98 * local_2460._12_4_;
            auVar36._16_4_ = fVar160 * local_2460._16_4_;
            auVar36._20_4_ = fVar162 * local_2460._20_4_;
            auVar36._24_4_ = fVar164 * local_2460._24_4_;
            auVar36._28_4_ = auVar13._28_4_;
            auVar62 = vfmsub213ps_fma(local_2460,local_24a0,auVar35);
            auVar37._4_4_ = auVar68._4_4_ * fVar140;
            auVar37._0_4_ = auVar68._0_4_ * fVar136;
            auVar37._8_4_ = auVar68._8_4_ * fVar141;
            auVar37._12_4_ = auVar68._12_4_ * fVar142;
            auVar37._16_4_ = auVar68._16_4_ * fVar143;
            auVar37._20_4_ = auVar68._20_4_ * fVar145;
            auVar37._24_4_ = auVar68._24_4_ * fVar146;
            auVar37._28_4_ = 0x34000000;
            auVar38._4_4_ = fVar90 * auVar16._4_4_;
            auVar38._0_4_ = fVar81 * auVar16._0_4_;
            auVar38._8_4_ = fVar94 * auVar16._8_4_;
            auVar38._12_4_ = fVar98 * auVar16._12_4_;
            auVar38._16_4_ = fVar160 * auVar16._16_4_;
            auVar38._20_4_ = fVar162 * auVar16._20_4_;
            auVar38._24_4_ = fVar164 * auVar16._24_4_;
            auVar38._28_4_ = local_2500._28_4_;
            auVar83 = vfmsub213ps_fma(auVar16,local_2480,auVar37);
            auVar64 = vandps_avx(auVar35,auVar109);
            auVar13 = vandps_avx(auVar37,auVar109);
            auVar64 = vcmpps_avx(auVar64,auVar13,1);
            auVar16 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar62),auVar64);
            auVar39._4_4_ = auVar18._4_4_ * fVar92;
            auVar39._0_4_ = auVar18._0_4_ * fVar88;
            auVar39._8_4_ = auVar18._8_4_ * fVar96;
            auVar39._12_4_ = auVar18._12_4_ * fVar144;
            auVar39._16_4_ = auVar18._16_4_ * fVar161;
            auVar39._20_4_ = auVar18._20_4_ * fVar163;
            auVar39._24_4_ = auVar18._24_4_ * fVar165;
            auVar39._28_4_ = auVar13._28_4_;
            auVar62 = vfmsub213ps_fma(auVar18,local_24a0,auVar38);
            auVar40._4_4_ = local_2420._4_4_ * fVar140;
            auVar40._0_4_ = local_2420._0_4_ * fVar136;
            auVar40._8_4_ = local_2420._8_4_ * fVar141;
            auVar40._12_4_ = local_2420._12_4_ * fVar142;
            auVar40._16_4_ = local_2420._16_4_ * fVar143;
            auVar40._20_4_ = local_2420._20_4_ * fVar145;
            auVar40._24_4_ = local_2420._24_4_ * fVar146;
            auVar40._28_4_ = local_24a0._28_4_;
            auVar83 = vfmsub213ps_fma(local_2440,local_24c0,auVar40);
            auVar64 = vandps_avx(auVar40,auVar109);
            auVar13 = vandps_avx(auVar38,auVar109);
            auVar64 = vcmpps_avx(auVar64,auVar13,1);
            auVar18 = vblendvps_avx(ZEXT1632(auVar62),ZEXT1632(auVar83),auVar64);
            auVar62 = vfmsub213ps_fma(local_2420,local_2480,auVar36);
            auVar83 = vfmsub213ps_fma(auVar68,local_24c0,auVar39);
            auVar64 = vandps_avx(auVar36,auVar109);
            auVar13 = vandps_avx(auVar39,auVar109);
            auVar64 = vcmpps_avx(auVar64,auVar13,1);
            auVar13 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar62),auVar64);
            auVar62 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
            fVar81 = auVar13._0_4_;
            auVar67._0_4_ = fVar81 * local_2940._4_4_;
            fVar88 = auVar13._4_4_;
            auVar67._4_4_ = fVar88 * local_2940._4_4_;
            fVar90 = auVar13._8_4_;
            auVar67._8_4_ = fVar90 * local_2940._4_4_;
            fVar92 = auVar13._12_4_;
            auVar67._12_4_ = fVar92 * local_2940._4_4_;
            fVar94 = auVar13._16_4_;
            auVar67._16_4_ = fVar94 * local_2940._4_4_;
            fVar96 = auVar13._20_4_;
            auVar67._20_4_ = fVar96 * local_2940._4_4_;
            fVar98 = auVar13._24_4_;
            auVar67._24_4_ = fVar98 * local_2940._4_4_;
            auVar67._28_4_ = 0;
            auVar83 = vfmadd213ps_fma(auVar108,auVar18,auVar67);
            auVar83 = vfmadd213ps_fma(auVar159,auVar16,ZEXT1632(auVar83));
            auVar68 = ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                         CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                  CONCAT44(auVar83._4_4_ + auVar83._4_4_,
                                                           auVar83._0_4_ + auVar83._0_4_))));
            auVar119._0_4_ = fVar81 * fVar82;
            auVar119._4_4_ = fVar88 * fVar89;
            auVar119._8_4_ = fVar90 * fVar91;
            auVar119._12_4_ = fVar92 * fVar93;
            auVar119._16_4_ = fVar94 * fVar95;
            auVar119._20_4_ = fVar96 * fVar97;
            auVar119._24_4_ = fVar98 * fVar100;
            auVar119._28_4_ = 0;
            auVar83 = vfmadd213ps_fma(local_23e0,auVar18,auVar119);
            auVar63 = vfmadd213ps_fma(auVar15,auVar16,ZEXT1632(auVar83));
            auVar64 = vrcpps_avx(auVar68);
            auVar149._8_4_ = 0x3f800000;
            auVar149._0_8_ = 0x3f8000003f800000;
            auVar149._12_4_ = 0x3f800000;
            auVar149._16_4_ = 0x3f800000;
            auVar149._20_4_ = 0x3f800000;
            auVar149._24_4_ = 0x3f800000;
            auVar149._28_4_ = 0x3f800000;
            auVar83 = vfnmadd213ps_fma(auVar64,auVar68,auVar149);
            auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar64,auVar64);
            local_28e0._28_4_ = 0x3f800000;
            local_28e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar83._12_4_ * (auVar63._12_4_ + auVar63._12_4_),
                                    CONCAT48(auVar83._8_4_ * (auVar63._8_4_ + auVar63._8_4_),
                                             CONCAT44(auVar83._4_4_ *
                                                      (auVar63._4_4_ + auVar63._4_4_),
                                                      auVar83._0_4_ *
                                                      (auVar63._0_4_ + auVar63._0_4_)))));
            auVar112 = ZEXT3264(local_28e0);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar120._4_4_ = uVar1;
            auVar120._0_4_ = uVar1;
            auVar120._8_4_ = uVar1;
            auVar120._12_4_ = uVar1;
            auVar120._16_4_ = uVar1;
            auVar120._20_4_ = uVar1;
            auVar120._24_4_ = uVar1;
            auVar120._28_4_ = uVar1;
            auVar64 = vcmpps_avx(auVar120,local_28e0,2);
            auVar139._4_4_ = fVar99;
            auVar139._0_4_ = fVar99;
            auVar139._8_4_ = fVar99;
            auVar139._12_4_ = fVar99;
            auVar139._16_4_ = fVar99;
            auVar139._20_4_ = fVar99;
            auVar139._24_4_ = fVar99;
            auVar139._28_4_ = fVar99;
            auVar84 = vcmpps_avx(local_28e0,auVar139,2);
            auVar64 = vandps_avx(auVar84,auVar64);
            auVar83 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
            auVar62 = vpand_avx(auVar83,auVar62);
            auVar64 = vpmovsxwd_avx2(auVar62);
            if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar64 >> 0x7f,0) != '\0') ||
                  (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar64 >> 0xbf,0) != '\0') ||
                (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar64[0x1f] < '\0') {
              auVar64 = vcmpps_avx(auVar68,_DAT_01f7b000,4);
              auVar83 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
              auVar62 = vpand_avx(auVar62,auVar83);
              local_27c0 = vpmovsxwd_avx2(auVar62);
              if ((((((((local_27c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_27c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_27c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_27c0 >> 0x7f,0) != '\0') ||
                    (local_27c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_27c0 >> 0xbf,0) != '\0') ||
                  (local_27c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_27c0[0x1f] < '\0') {
                local_2800 = local_24e0;
                local_27e0 = &local_2a49;
                auVar64 = vsubps_avx(local_24e0,auVar166);
                auVar64 = vblendvps_avx(auVar104,auVar64,local_2580);
                auVar84 = vsubps_avx(local_24e0,auVar104);
                local_2820 = vblendvps_avx(auVar166,auVar84,local_2580);
                local_2760 = local_28e0;
                local_2740[0] = auVar16._0_4_ * (float)local_25a0._0_4_;
                local_2740[1] = auVar16._4_4_ * (float)local_25a0._4_4_;
                local_2740[2] = auVar16._8_4_ * fStack_2598;
                local_2740[3] = auVar16._12_4_ * fStack_2594;
                fStack_2730 = auVar16._16_4_ * fStack_2590;
                fStack_272c = auVar16._20_4_ * fStack_258c;
                fStack_2728 = auVar16._24_4_ * fStack_2588;
                uStack_2724 = local_2580._28_4_;
                local_2720[0] = (float)local_25a0._0_4_ * auVar18._0_4_;
                local_2720[1] = (float)local_25a0._4_4_ * auVar18._4_4_;
                local_2720[2] = fStack_2598 * auVar18._8_4_;
                local_2720[3] = fStack_2594 * auVar18._12_4_;
                fStack_2710 = fStack_2590 * auVar18._16_4_;
                fStack_270c = fStack_258c * auVar18._20_4_;
                fStack_2708 = fStack_2588 * auVar18._24_4_;
                uStack_2704 = local_2580._28_4_;
                local_2700[0] = (float)local_25a0._0_4_ * fVar81;
                local_2700[1] = (float)local_25a0._4_4_ * fVar88;
                local_2700[2] = fStack_2598 * fVar90;
                local_2700[3] = fStack_2594 * fVar92;
                fStack_26f0 = fStack_2590 * fVar94;
                fStack_26ec = fStack_258c * fVar96;
                fStack_26e8 = fStack_2588 * fVar98;
                uStack_26e4 = auVar13._28_4_;
                auVar87._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                auVar87._8_4_ = local_2a3c;
                auVar87._12_4_ = local_2a3c;
                auVar87._16_4_ = local_2a3c;
                auVar87._20_4_ = local_2a3c;
                auVar87._24_4_ = local_2a3c;
                auVar87._28_4_ = local_2a3c;
                auVar84 = vpaddd_avx2(auVar87,_DAT_01fb7740);
                auVar113._0_4_ = (float)(int)(*(ushort *)(local_2988 + 8 + lVar57) - 1);
                auVar113._4_12_ = auVar71._4_12_;
                auVar62 = vrcpss_avx(auVar113,auVar113);
                auVar83 = vfnmadd213ss_fma(auVar62,auVar113,ZEXT416(0x40000000));
                fVar99 = auVar62._0_4_ * auVar83._0_4_;
                auVar84 = vcvtdq2ps_avx(auVar84);
                fVar100 = auVar84._28_4_ + auVar64._28_4_;
                fVar82 = (fVar70 * auVar84._0_4_ + auVar64._0_4_) * fVar99;
                fVar89 = (fVar78 * auVar84._4_4_ + auVar64._4_4_) * fVar99;
                local_2840._4_4_ = fVar89;
                local_2840._0_4_ = fVar82;
                fVar91 = (fVar79 * auVar84._8_4_ + auVar64._8_4_) * fVar99;
                local_2840._8_4_ = fVar91;
                fVar93 = (fVar80 * auVar84._12_4_ + auVar64._12_4_) * fVar99;
                local_2840._12_4_ = fVar93;
                fVar95 = (auVar84._16_4_ * 0.0 + auVar64._16_4_) * fVar99;
                local_2840._16_4_ = fVar95;
                fVar97 = (auVar84._20_4_ * 0.0 + auVar64._20_4_) * fVar99;
                local_2840._20_4_ = fVar97;
                fVar99 = (auVar84._24_4_ * 0.0 + auVar64._24_4_) * fVar99;
                local_2840._24_4_ = fVar99;
                local_2840._28_4_ = fVar100;
                pGVar11 = (local_2980->geometries).items[(uint)local_2920._4_4_].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar110._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                  auVar110._8_4_ = local_2a40;
                  auVar110._12_4_ = local_2a40;
                  auVar110._16_4_ = local_2a40;
                  auVar110._20_4_ = local_2a40;
                  auVar110._24_4_ = local_2a40;
                  auVar110._28_4_ = local_2a40;
                  auVar64 = vpaddd_avx2(auVar110,_DAT_01fb7760);
                  auVar84 = vcvtdq2ps_avx(auVar64);
                  auVar114._0_4_ = (float)(int)(*(ushort *)(local_2988 + 10 + lVar57) - 1);
                  auVar114._4_12_ = auVar71._4_12_;
                  auVar62 = vrcpss_avx(auVar114,auVar114);
                  auVar71 = vfnmadd213ss_fma(auVar62,auVar114,ZEXT416(0x40000000));
                  fVar81 = auVar62._0_4_ * auVar71._0_4_;
                  auVar64 = vrcpps_avx(local_24e0);
                  auVar121._8_4_ = 0x3f800000;
                  auVar121._0_8_ = 0x3f8000003f800000;
                  auVar121._12_4_ = 0x3f800000;
                  auVar121._16_4_ = 0x3f800000;
                  auVar121._20_4_ = 0x3f800000;
                  auVar121._24_4_ = 0x3f800000;
                  auVar121._28_4_ = 0x3f800000;
                  auVar62 = vfnmadd213ps_fma(local_24e0,auVar64,auVar121);
                  auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar64,auVar64);
                  auVar111._8_4_ = 0x219392ef;
                  auVar111._0_8_ = 0x219392ef219392ef;
                  auVar111._12_4_ = 0x219392ef;
                  auVar111._16_4_ = 0x219392ef;
                  auVar111._20_4_ = 0x219392ef;
                  auVar111._24_4_ = 0x219392ef;
                  auVar111._28_4_ = 0x219392ef;
                  auVar64 = vcmpps_avx(local_2500,auVar111,5);
                  auVar64 = vandps_avx(auVar64,ZEXT1632(auVar62));
                  auVar41._4_4_ = fVar89 * auVar64._4_4_;
                  auVar41._0_4_ = fVar82 * auVar64._0_4_;
                  auVar41._8_4_ = fVar91 * auVar64._8_4_;
                  auVar41._12_4_ = fVar93 * auVar64._12_4_;
                  auVar41._16_4_ = fVar95 * auVar64._16_4_;
                  auVar41._20_4_ = fVar97 * auVar64._20_4_;
                  auVar41._24_4_ = fVar99 * auVar64._24_4_;
                  auVar41._28_4_ = fVar100;
                  local_27a0 = vminps_avx(auVar41,auVar121);
                  auVar42._4_4_ =
                       (fVar78 * auVar84._4_4_ + local_2820._4_4_) * fVar81 * auVar64._4_4_;
                  auVar42._0_4_ =
                       (fVar70 * auVar84._0_4_ + local_2820._0_4_) * fVar81 * auVar64._0_4_;
                  auVar42._8_4_ =
                       (fVar79 * auVar84._8_4_ + local_2820._8_4_) * fVar81 * auVar64._8_4_;
                  auVar42._12_4_ =
                       (fVar80 * auVar84._12_4_ + local_2820._12_4_) * fVar81 * auVar64._12_4_;
                  auVar42._16_4_ =
                       (auVar84._16_4_ * 0.0 + local_2820._16_4_) * fVar81 * auVar64._16_4_;
                  auVar42._20_4_ =
                       (auVar84._20_4_ * 0.0 + local_2820._20_4_) * fVar81 * auVar64._20_4_;
                  auVar42._24_4_ =
                       (auVar84._24_4_ * 0.0 + local_2820._24_4_) * fVar81 * auVar64._24_4_;
                  auVar42._28_4_ = auVar64._28_4_;
                  local_2780 = vminps_avx(auVar42,auVar121);
                  auVar76._8_4_ = 0x7f800000;
                  auVar76._0_8_ = 0x7f8000007f800000;
                  auVar76._12_4_ = 0x7f800000;
                  auVar76._16_4_ = 0x7f800000;
                  auVar76._20_4_ = 0x7f800000;
                  auVar76._24_4_ = 0x7f800000;
                  auVar76._28_4_ = 0x7f800000;
                  auVar64 = vblendvps_avx(auVar76,local_28e0,local_27c0);
                  auVar84 = vshufps_avx(auVar64,auVar64,0xb1);
                  auVar84 = vminps_avx(auVar64,auVar84);
                  auVar13 = vshufpd_avx(auVar84,auVar84,5);
                  auVar84 = vminps_avx(auVar84,auVar13);
                  auVar13 = vpermpd_avx2(auVar84,0x4e);
                  auVar84 = vminps_avx(auVar84,auVar13);
                  auVar84 = vcmpps_avx(auVar64,auVar84,0);
                  auVar13 = local_27c0 & auVar84;
                  auVar64 = local_27c0;
                  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0x7f,0) != '\0') ||
                        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0xbf,0) != '\0') ||
                      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar13[0x1f] < '\0') {
                    auVar64 = vandps_avx(auVar84,local_27c0);
                  }
                  uVar44 = vmovmskps_avx(auVar64);
                  uVar45 = 0;
                  for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x80000000) {
                    uVar45 = uVar45 + 1;
                  }
                  uVar54 = (ulong)uVar45;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar1 = *(undefined4 *)(local_27a0 + uVar54 * 4);
                    uVar3 = *(undefined4 *)(local_2780 + uVar54 * 4);
                    fVar99 = local_2740[uVar54];
                    fVar82 = local_2720[uVar54];
                    fVar89 = local_2700[uVar54];
                    *(float *)(ray + k * 4 + 0x80) = local_2740[uVar54 - 8];
                    *(float *)(ray + k * 4 + 0xc0) = fVar99;
                    *(float *)(ray + k * 4 + 0xd0) = fVar82;
                    *(float *)(ray + k * 4 + 0xe0) = fVar89;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(uint *)(ray + k * 4 + 0x110) = uVar43;
                    *(undefined4 *)(ray + k * 4 + 0x120) = local_2920._4_4_;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_2920._0_4_ = local_2920._4_4_;
                    local_2920._8_4_ = local_2920._4_4_;
                    auStack_2910 = auVar159._16_16_;
                    local_2920._12_4_ = local_2920._4_4_;
                    local_2940._4_4_ = (float)uVar43;
                    local_2940._0_4_ = uVar43;
                    uStack_2938._0_4_ = uVar43;
                    _fStack_2930 = auVar17._16_16_;
                    uStack_2938._4_4_ = uVar43;
                    local_2a30 = *local_2a08;
                    auStack_28f0 = auVar108._16_16_;
                    local_2900 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    local_2860 = local_27c0;
                    while( true ) {
                      local_26a0 = *(undefined4 *)(local_27a0 + uVar54 * 4);
                      local_2690 = *(undefined4 *)(local_2780 + uVar54 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_2740[uVar54 - 8];
                      local_2970.context = context->user;
                      local_26d0 = local_2740[uVar54];
                      fVar99 = local_2720[uVar54];
                      auVar101._4_4_ = fVar99;
                      auVar101._0_4_ = fVar99;
                      auVar101._8_4_ = fVar99;
                      auVar101._12_4_ = fVar99;
                      fVar99 = local_2700[uVar54];
                      local_26b0._4_4_ = fVar99;
                      local_26b0._0_4_ = fVar99;
                      local_26b0._8_4_ = fVar99;
                      local_26b0._12_4_ = fVar99;
                      fStack_26cc = local_26d0;
                      fStack_26c8 = local_26d0;
                      fStack_26c4 = local_26d0;
                      local_26c0 = auVar101;
                      uStack_269c = local_26a0;
                      uStack_2698 = local_26a0;
                      uStack_2694 = local_26a0;
                      uStack_268c = local_2690;
                      uStack_2688 = local_2690;
                      uStack_2684 = local_2690;
                      local_2680 = local_2940;
                      uStack_2678 = uStack_2938;
                      local_2670 = local_2920;
                      vpcmpeqd_avx2(ZEXT1632(local_2920),ZEXT1632(local_2920));
                      uStack_265c = (local_2970.context)->instID[0];
                      local_2660 = uStack_265c;
                      uStack_2658 = uStack_265c;
                      uStack_2654 = uStack_265c;
                      uStack_2650 = (local_2970.context)->instPrimID[0];
                      uStack_264c = uStack_2650;
                      uStack_2648 = uStack_2650;
                      uStack_2644 = uStack_2650;
                      local_2a20 = local_2a30;
                      local_2970.valid = (int *)local_2a20;
                      local_2970.geometryUserPtr = pGVar11->userPtr;
                      local_2970.hit = (RTCHitN *)&local_26d0;
                      local_2970.N = 4;
                      local_2970.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_2970);
                        auVar112 = ZEXT3264(local_28e0);
                      }
                      if (local_2a20 == (undefined1  [16])0x0) {
                        auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                        auVar62 = auVar62 ^ auVar71;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        auVar71 = vpcmpeqd_avx(auVar101,auVar101);
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_2970);
                          auVar112 = ZEXT3264(local_28e0);
                          auVar71 = vpcmpeqd_avx(auVar71,auVar71);
                        }
                        auVar83 = vpcmpeqd_avx(local_2a20,_DAT_01f45a50);
                        auVar62 = auVar83 ^ auVar71;
                        if (local_2a20 != (undefined1  [16])0x0) {
                          auVar83 = auVar83 ^ auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])local_2970.hit);
                          *(undefined1 (*) [16])(local_2970.ray + 0xc0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x10));
                          *(undefined1 (*) [16])(local_2970.ray + 0xd0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x20));
                          *(undefined1 (*) [16])(local_2970.ray + 0xe0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x30));
                          *(undefined1 (*) [16])(local_2970.ray + 0xf0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x40));
                          *(undefined1 (*) [16])(local_2970.ray + 0x100) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x50));
                          *(undefined1 (*) [16])(local_2970.ray + 0x110) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x60));
                          *(undefined1 (*) [16])(local_2970.ray + 0x120) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x70));
                          *(undefined1 (*) [16])(local_2970.ray + 0x130) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                            (local_2970.hit + 0x80));
                          *(undefined1 (*) [16])(local_2970.ray + 0x140) = auVar71;
                        }
                      }
                      auVar64 = _local_2900;
                      auVar72._8_8_ = 0x100000001;
                      auVar72._0_8_ = 0x100000001;
                      if ((auVar72 & auVar62) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_2900._0_4_;
                      }
                      else {
                        local_2900._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_2900._4_4_ = 0;
                        local_2900._8_4_ = 0;
                        local_2900._12_4_ = 0;
                      }
                      *(undefined4 *)(local_2860 + uVar54 * 4) = 0;
                      auStack_28f0 = auVar64._16_16_;
                      auVar69._4_4_ = local_2900._0_4_;
                      auVar69._0_4_ = local_2900._0_4_;
                      auVar69._8_4_ = local_2900._0_4_;
                      auVar69._12_4_ = local_2900._0_4_;
                      auVar69._16_4_ = local_2900._0_4_;
                      auVar69._20_4_ = local_2900._0_4_;
                      auVar69._24_4_ = local_2900._0_4_;
                      auVar69._28_4_ = local_2900._0_4_;
                      auVar84 = vcmpps_avx(auVar112._0_32_,auVar69,2);
                      auVar64 = vandps_avx(auVar84,local_2860);
                      local_2860 = local_2860 & auVar84;
                      if ((((((((local_2860 >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_2860 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (local_2860 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(local_2860 >> 0x7f,0) == '\0')
                            && (local_2860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                            ) && SUB321(local_2860 >> 0xbf,0) == '\0') &&
                          (local_2860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_2860[0x1f]) break;
                      auVar77._8_4_ = 0x7f800000;
                      auVar77._0_8_ = 0x7f8000007f800000;
                      auVar77._12_4_ = 0x7f800000;
                      auVar77._16_4_ = 0x7f800000;
                      auVar77._20_4_ = 0x7f800000;
                      auVar77._24_4_ = 0x7f800000;
                      auVar77._28_4_ = 0x7f800000;
                      auVar84 = vblendvps_avx(auVar77,auVar112._0_32_,auVar64);
                      auVar13 = vshufps_avx(auVar84,auVar84,0xb1);
                      auVar13 = vminps_avx(auVar84,auVar13);
                      auVar15 = vshufpd_avx(auVar13,auVar13,5);
                      auVar13 = vminps_avx(auVar13,auVar15);
                      auVar15 = vpermpd_avx2(auVar13,0x4e);
                      auVar13 = vminps_avx(auVar13,auVar15);
                      auVar13 = vcmpps_avx(auVar84,auVar13,0);
                      auVar15 = auVar64 & auVar13;
                      auVar84 = auVar64;
                      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar15 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar15 >> 0x7f,0) != '\0') ||
                            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar15 >> 0xbf,0) != '\0') ||
                          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar15[0x1f] < '\0') {
                        auVar84 = vandps_avx(auVar13,auVar64);
                      }
                      uVar45 = vmovmskps_avx(auVar84);
                      uVar43 = 0;
                      for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x80000000) {
                        uVar43 = uVar43 + 1;
                      }
                      uVar54 = (ulong)uVar43;
                      local_2860 = auVar64;
                    }
                  }
                }
              }
            }
          }
          auVar150 = ZEXT3264(local_2520);
          auVar167 = ZEXT3264(local_28a0);
          uVar54 = local_2a48;
          uVar51 = local_29a0;
          uVar56 = local_29a8;
          uVar58 = local_29b0;
          pauVar55 = local_2998;
          uVar59 = local_29c0;
          uVar61 = local_29b8;
          fVar89 = local_2880;
          fVar160 = fStack_287c;
          fVar161 = fStack_2878;
          fVar162 = fStack_2874;
          fVar163 = fStack_2870;
          fVar164 = fStack_286c;
          fVar165 = fStack_2868;
          fVar78 = local_2540;
          fVar79 = fStack_253c;
          fVar80 = fStack_2538;
          fVar136 = fStack_2534;
          fVar140 = fStack_2530;
          fVar141 = fStack_252c;
          fVar95 = fStack_2528;
          fVar142 = local_2560;
          fVar143 = fStack_255c;
          fVar145 = fStack_2558;
          fVar146 = fStack_2554;
          fVar147 = fStack_2550;
          fVar151 = fStack_254c;
          fVar82 = fStack_2548;
        }
      }
      auVar128 = ZEXT3264(local_25c0);
      auVar122 = ZEXT3264(local_25e0);
      auVar112 = ZEXT3264(local_2640);
      fVar99 = local_2600;
      fVar97 = fStack_25fc;
      fVar100 = fStack_25f8;
      fVar81 = fStack_25f4;
      fVar70 = fStack_25f0;
      fVar88 = fStack_25ec;
      fVar91 = fStack_25e8;
      fVar90 = local_2620;
      fVar92 = fStack_261c;
      fVar94 = fStack_2618;
      fVar96 = fStack_2614;
      fVar98 = fStack_2610;
      fVar144 = fStack_260c;
      fVar93 = fStack_2608;
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    local_28c0._4_4_ = uVar1;
    local_28c0._0_4_ = uVar1;
    local_28c0._8_4_ = uVar1;
    local_28c0._12_4_ = uVar1;
    local_28c0._16_4_ = uVar1;
    local_28c0._20_4_ = uVar1;
    local_28c0._24_4_ = uVar1;
    local_28c0._28_4_ = uVar1;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }